

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O1

int32_t __thiscall icu_63::ChineseCalendar::majorSolarTerm(ChineseCalendar *this,int32_t days)

{
  int iVar1;
  int iVar2;
  CalendarAstronomer *pCVar3;
  undefined4 in_register_00000034;
  size_t size;
  double dVar4;
  
  size = CONCAT44(in_register_00000034,days);
  umtx_lock_63(&astroLock);
  if (gChineseCalendarAstro == (CalendarAstronomer *)0x0) {
    pCVar3 = (CalendarAstronomer *)UMemory::operator_new((UMemory *)0x88,size);
    if (pCVar3 == (CalendarAstronomer *)0x0) {
      pCVar3 = (CalendarAstronomer *)0x0;
    }
    else {
      CalendarAstronomer::CalendarAstronomer(pCVar3);
    }
    gChineseCalendarAstro = pCVar3;
    ucln_i18n_registerCleanup_63(UCLN_I18N_CHINESE_CALENDAR,calendar_chinese_cleanup);
  }
  pCVar3 = gChineseCalendarAstro;
  dVar4 = daysToMillis(this,(double)days);
  CalendarAstronomer::setTime(pCVar3,dVar4);
  dVar4 = CalendarAstronomer::getSunLongitude(gChineseCalendarAstro);
  umtx_unlock_63(&astroLock);
  iVar1 = (int)((dVar4 * 6.0) / 3.141592653589793) + 2;
  iVar1 = iVar1 + (((uint)(iVar1 / 6 + (iVar1 >> 0x1f)) >> 1) - (iVar1 >> 0x1f)) * -0xc;
  iVar2 = iVar1 + 0xc;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int32_t ChineseCalendar::majorSolarTerm(int32_t days) const {
    
    umtx_lock(&astroLock);
    if(gChineseCalendarAstro == NULL) {
        gChineseCalendarAstro = new CalendarAstronomer();
        ucln_i18n_registerCleanup(UCLN_I18N_CHINESE_CALENDAR, calendar_chinese_cleanup);
    }
    gChineseCalendarAstro->setTime(daysToMillis(days));
    UDate solarLongitude = gChineseCalendarAstro->getSunLongitude();
    umtx_unlock(&astroLock);

    // Compute (floor(solarLongitude / (pi/6)) + 2) % 12
    int32_t term = ( ((int32_t)(6 * solarLongitude / CalendarAstronomer::PI)) + 2 ) % 12;
    if (term < 1) {
        term += 12;
    }
    return term;
}